

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O2

void ssw_writerecord(mcpl_generic_wfilehandle_t *fh,int reclen,size_t lbuf,char *buf)

{
  uint64_t *puVar1;
  undefined8 uStack_40;
  uint32_t rl;
  uint64_t rl_1;
  
  if (reclen == 4) {
    if (lbuf >> 0x20 != 0) {
      ssw_error("output record size too large for 32bit records");
    }
    puVar1 = (uint64_t *)&rl;
    rl = (uint32_t)lbuf;
    uStack_40 = 4;
  }
  else {
    puVar1 = &rl_1;
    uStack_40 = 8;
    rl_1 = lbuf;
  }
  mcpl_generic_fwrite(fh,puVar1,uStack_40);
  mcpl_generic_fwrite(fh,buf,lbuf);
  mcpl_generic_fwrite(fh,puVar1,uStack_40);
  return;
}

Assistant:

void ssw_writerecord( mcpl_generic_wfilehandle_t* fh,
                      int reclen, size_t lbuf, char* buf )
{
  if (reclen==4) {
    if ( lbuf > UINT32_MAX )
      ssw_error("output record size too large for 32bit records");
    uint32_t rl = (uint32_t)lbuf;
    mcpl_generic_fwrite( fh, (char*)&rl, sizeof(rl) );
    mcpl_generic_fwrite( fh, buf, lbuf );
    mcpl_generic_fwrite( fh, (char*)&rl, sizeof(rl) );
  } else {
    assert(reclen==8);
    uint64_t rl = lbuf;
    mcpl_generic_fwrite( fh, (char*)&rl, sizeof(rl) );
    mcpl_generic_fwrite( fh, buf, lbuf );
    mcpl_generic_fwrite( fh, (char*)&rl, sizeof(rl) );
  }
}